

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InertiaNonLinearParametrization.cpp
# Opt level: O1

void __thiscall
iDynTree::RigidBodyInertiaNonLinearParametrization::fromRigidBodyInertia
          (RigidBodyInertiaNonLinearParametrization *this,SpatialInertia *inertia)

{
  double dVar1;
  ActualDstType actualDst;
  RotationalInertia inertiaAtCOM;
  JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2> eigenValuesSolver;
  MatrixType local_228;
  RotationalInertia local_1e0;
  JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2> local_198;
  
  dVar1 = SpatialInertia::getMass(inertia);
  this->mass = dVar1;
  SpatialInertia::getCenterOfMass((Position *)&local_198,inertia);
  Position::operator=(&this->com,(Position *)&local_198);
  SpatialInertia::getRotationalInertiaWrtCenterOfMass(&local_1e0,inertia);
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.
  m_computationOptions = 0;
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.m_info =
       Success;
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.
  m_isInitialized = false;
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.m_isAllocated
       = false;
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.
  m_usePrescribedThreshold = false;
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.m_computeFullU
       = false;
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.m_computeThinU
       = false;
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.m_computeFullV
       = false;
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.m_computeThinV
       = false;
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.m_rows._0_4_ =
       0xffffffff;
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.m_rows._4_4_ =
       0xffffffff;
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.m_cols._0_4_ =
       0xffffffff;
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.m_cols._4_4_ =
       0xffffffff;
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.m_diagSize = 0
  ;
  local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       local_1e0.super_Matrix3x3.m_data[0];
  local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       local_1e0.super_Matrix3x3.m_data[3];
  local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       local_1e0.super_Matrix3x3.m_data[6];
  local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       local_1e0.super_Matrix3x3.m_data[1];
  local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       local_1e0.super_Matrix3x3.m_data[4];
  local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       local_1e0.super_Matrix3x3.m_data[7];
  local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       local_1e0.super_Matrix3x3.m_data[2];
  local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       local_1e0.super_Matrix3x3.m_data[5];
  local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       local_1e0.super_Matrix3x3.m_data[8];
  Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>::compute(&local_198,&local_228,0x14);
  (this->centralSecondMomentOfMass).m_data[0] =
       ((local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.
         m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[1] +
        local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.
        m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
        m_data.array[2]) -
       local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.
       m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
       m_data.array[0]) * 0.5;
  (this->centralSecondMomentOfMass).m_data[1] =
       ((local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.
         m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[0] +
        local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.
        m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
        m_data.array[2]) -
       local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.
       m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
       m_data.array[1]) * 0.5;
  (this->centralSecondMomentOfMass).m_data[2] =
       ((local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.
         m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[1] +
        local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.
        m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
        m_data.array[0]) -
       local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.
       m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
       m_data.array[2]) * 0.5;
  (this->link_R_centroidal).super_Matrix3x3.m_data[0] =
       local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.m_matrixU
       .super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0];
  (this->link_R_centroidal).super_Matrix3x3.m_data[1] =
       local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.m_matrixU
       .super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3];
  (this->link_R_centroidal).super_Matrix3x3.m_data[2] =
       local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.m_matrixU
       .super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6];
  (this->link_R_centroidal).super_Matrix3x3.m_data[3] =
       local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.m_matrixU
       .super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1];
  (this->link_R_centroidal).super_Matrix3x3.m_data[4] =
       local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.m_matrixU
       .super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4];
  (this->link_R_centroidal).super_Matrix3x3.m_data[5] =
       local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.m_matrixU
       .super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7];
  (this->link_R_centroidal).super_Matrix3x3.m_data[6] =
       local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.m_matrixU
       .super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2];
  (this->link_R_centroidal).super_Matrix3x3.m_data[7] =
       local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.m_matrixU
       .super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5];
  (this->link_R_centroidal).super_Matrix3x3.m_data[8] =
       local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.m_matrixU
       .super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8];
  return;
}

Assistant:

void RigidBodyInertiaNonLinearParametrization::fromRigidBodyInertia(const SpatialInertia& inertia)
{
    using namespace Eigen;

    // We get the mass and the center of mass
    this->mass = inertia.getMass();

    this->com = inertia.getCenterOfMass();

    // We get the inertia at the COM
    RotationalInertia inertiaAtCOM = inertia.getRotationalInertiaWrtCenterOfMass();

    // We get the inertia at the principal axis using eigen
    JacobiSVD<Matrix<double,3,3,RowMajor> > eigenValuesSolver;

    // We check both the positive definitiveness of the matrix and the triangle
    // inequality by directly checking the central second moment of mass of the rigid body
    // In a nutshell, we have that:
    // Ixx = Cyy + Czz
    // Iyy = Cxx + Czz
    // Izz = Cxx + Cyy
    // so
    // Cxx = (Iyy + Izz - Ixx)/2
    // Cyy = (Ixx + Izz - Iyy)/2
    // Czz = (Ixx + Iyy - Izz)/2
    // Then all the condition boils down to:
    // Cxx >= 0 , Cyy >= 0 , Czz >= 0
    eigenValuesSolver.compute( toEigen(inertiaAtCOM) , Eigen::ComputeFullU | Eigen::ComputeFullV);

    double Ixx = eigenValuesSolver.singularValues()(0);
    double Iyy = eigenValuesSolver.singularValues()(1);
    double Izz = eigenValuesSolver.singularValues()(2);

    double Cxx = (Iyy + Izz - Ixx)/2;
    double Cyy = (Ixx + Izz - Iyy)/2;
    double Czz = (Ixx + Iyy - Izz)/2;

    this->centralSecondMomentOfMass(0) = Cxx;
    this->centralSecondMomentOfMass(1) = Cyy;
    this->centralSecondMomentOfMass(2) = Czz;

    toEigen(this->link_R_centroidal) = eigenValuesSolver.matrixU();
}